

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

bool absl::synchronization_internal::ForwardDFS(Rep *r,int32_t n,int32_t upper_bound)

{
  Node *pNVar1;
  bool bVar2;
  uint32_t *puVar3;
  Node **ppNVar4;
  Node *nw;
  int32_t _cursor;
  int32_t w;
  Node *nn;
  int32_t upper_bound_local;
  int32_t n_local;
  Rep *r_local;
  
  nn._0_4_ = upper_bound;
  nn._4_4_ = n;
  _upper_bound_local = r;
  anon_unknown_0::Vec<int>::clear(&r->deltaf_);
  anon_unknown_0::Vec<int>::clear(&_upper_bound_local->stack_);
  anon_unknown_0::Vec<int>::push_back(&_upper_bound_local->stack_,(int *)((long)&nn + 4));
  do {
    do {
      bVar2 = anon_unknown_0::Vec<int>::empty(&_upper_bound_local->stack_);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        return true;
      }
      puVar3 = (uint32_t *)anon_unknown_0::Vec<int>::back(&_upper_bound_local->stack_);
      nn._4_4_ = *puVar3;
      anon_unknown_0::Vec<int>::pop_back(&_upper_bound_local->stack_);
      ppNVar4 = anon_unknown_0::Vec<absl::synchronization_internal::(anonymous_namespace)::Node_*>::
                operator[](&_upper_bound_local->nodes_,nn._4_4_);
      __cursor = *ppNVar4;
    } while ((__cursor->visited & 1U) != 0);
    __cursor->visited = true;
    anon_unknown_0::Vec<int>::push_back(&_upper_bound_local->deltaf_,(int *)((long)&nn + 4));
    nw._0_4_ = 0;
    while (bVar2 = anon_unknown_0::NodeSet::Next
                             (&__cursor->out,(int32_t *)&nw,(int32_t *)((long)&nw + 4)), bVar2) {
      ppNVar4 = anon_unknown_0::Vec<absl::synchronization_internal::(anonymous_namespace)::Node_*>::
                operator[](&_upper_bound_local->nodes_,nw._4_4_);
      pNVar1 = *ppNVar4;
      if (pNVar1->rank == (int32_t)nn) {
        return false;
      }
      if (((pNVar1->visited & 1U) == 0) && (pNVar1->rank < (int32_t)nn)) {
        anon_unknown_0::Vec<int>::push_back(&_upper_bound_local->stack_,(int *)((long)&nw + 4));
      }
    }
  } while( true );
}

Assistant:

static bool ForwardDFS(GraphCycles::Rep* r, int32_t n, int32_t upper_bound) {
  // Avoid recursion since stack space might be limited.
  // We instead keep a stack of nodes to visit.
  r->deltaf_.clear();
  r->stack_.clear();
  r->stack_.push_back(n);
  while (!r->stack_.empty()) {
    n = r->stack_.back();
    r->stack_.pop_back();
    Node* nn = r->nodes_[n];
    if (nn->visited) continue;

    nn->visited = true;
    r->deltaf_.push_back(n);

    HASH_FOR_EACH(w, nn->out) {
      Node* nw = r->nodes_[w];
      if (nw->rank == upper_bound) {
        return false;  // Cycle
      }
      if (!nw->visited && nw->rank < upper_bound) {
        r->stack_.push_back(w);
      }
    }
  }
  return true;
}